

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::New
          (Recycler *recycler,int initialCapacity,uint16 inlineSlotCapacity,
          uint16 offsetOfInlineSlots,bool isLocked,bool isShared)

{
  Recycler *alloc;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *this;
  undefined6 in_register_0000000a;
  undefined7 in_register_00000081;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  data.line = (DWORD)CONCAT71(in_register_00000081,isLocked);
  data._36_4_ = SUB84(CONCAT62(in_register_0000000a,offsetOfInlineSlots),0);
  PropertyIndexRangesBase<Js::PropertyIndexRanges<int>_>::VerifySlotCapacity(initialCapacity);
  local_60 = (undefined1  [8])
             &SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9ef1b8b;
  data.filename._0_4_ = 0xf3;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_60);
  this = (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)
         new<Memory::Recycler>(0x30,alloc,0x38bbb2);
  SimpleDictionaryTypeHandlerBase
            (this,recycler,initialCapacity,inlineSlotCapacity,data._36_2_,SUB41(data.line,0),
             isShared);
  return this;
}

Assistant:

SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported> * SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::New(Recycler * recycler, int initialCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots, bool isLocked, bool isShared)
    {
        PropertyIndexRangesType::VerifySlotCapacity(initialCapacity);
        return RecyclerNew(recycler, SimpleDictionaryTypeHandlerBase, recycler, initialCapacity, inlineSlotCapacity, offsetOfInlineSlots, isLocked, isShared);
    }